

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splines.h
# Opt level: O0

Point3f pbrt::EvaluateCubicBezier(span<const_pbrt::Point3<float>_> cp,Float u,Vector3f *deriv)

{
  undefined8 uVar1;
  Point3<float> p;
  Point3<float> p_00;
  Tuple3<pbrt::Vector3,_float> t;
  Tuple3<pbrt::Point3,_float> TVar2;
  Tuple3<pbrt::Point3,_float> t1;
  Tuple3<pbrt::Point3,_float> t1_00;
  Tuple3<pbrt::Point3,_float> t1_01;
  Tuple3<pbrt::Point3,_float> t1_02;
  Tuple3<pbrt::Point3,_float> t1_03;
  Tuple3<pbrt::Point3,_float> t1_04;
  Tuple3<pbrt::Point3,_float> t0;
  Tuple3<pbrt::Point3,_float> t0_00;
  Tuple3<pbrt::Point3,_float> t0_01;
  Tuple3<pbrt::Point3,_float> t0_02;
  Tuple3<pbrt::Point3,_float> t0_03;
  Tuple3<pbrt::Point3,_float> t0_04;
  Point3<float> *pPVar3;
  undefined8 *in_RDX;
  undefined4 in_XMM0_Da;
  float fVar4;
  undefined1 auVar15 [56];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  Point3<float> PVar16;
  Vector3<float> VVar17;
  Point3f cp2 [2];
  Point3f cp1 [3];
  undefined4 in_stack_fffffffffffffc68;
  undefined4 uVar18;
  float s;
  size_t i;
  span<const_pbrt::Point3<float>_> *this;
  float in_stack_fffffffffffffc90;
  Float in_stack_fffffffffffffd04;
  undefined8 in_stack_fffffffffffffd18;
  float in_stack_fffffffffffffd20;
  float in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  float in_stack_fffffffffffffd40;
  span<const_pbrt::Point3<float>_> local_20 [2];
  undefined1 auVar5 [64];
  undefined1 auVar10 [64];
  
  this = local_20;
  pstd::span<const_pbrt::Point3<float>_>::operator[](this,0);
  uVar18 = 1;
  s = 0.0;
  pstd::span<const_pbrt::Point3<float>_>::operator[](this,1);
  auVar15 = (undefined1  [56])0x0;
  t0.y = (float)in_stack_fffffffffffffd3c;
  t0.x = in_stack_fffffffffffffd38;
  t0.z = in_stack_fffffffffffffd40;
  t1.z = in_stack_fffffffffffffd20;
  t1.x = (float)(int)in_stack_fffffffffffffd18;
  t1.y = (float)(int)((ulong)in_stack_fffffffffffffd18 >> 0x20);
  PVar16 = Lerp<pbrt::Point3,float>(in_stack_fffffffffffffd04,t0,t1);
  auVar5._0_8_ = PVar16.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar5._8_56_ = auVar15;
  vmovlpd_avx(auVar5._0_16_);
  pstd::span<const_pbrt::Point3<float>_>::operator[](this,CONCAT44(s,uVar18));
  i = 2;
  pstd::span<const_pbrt::Point3<float>_>::operator[](this,2);
  auVar15 = (undefined1  [56])0x0;
  t0_00.y = (float)in_stack_fffffffffffffd3c;
  t0_00.x = in_stack_fffffffffffffd38;
  t0_00.z = in_stack_fffffffffffffd40;
  t1_00.z = in_stack_fffffffffffffd20;
  t1_00.x = (float)(int)in_stack_fffffffffffffd18;
  t1_00.y = (float)(int)((ulong)in_stack_fffffffffffffd18 >> 0x20);
  PVar16 = Lerp<pbrt::Point3,float>(in_stack_fffffffffffffd04,t0_00,t1_00);
  auVar6._0_8_ = PVar16.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar6._8_56_ = auVar15;
  vmovlpd_avx(auVar6._0_16_);
  pstd::span<const_pbrt::Point3<float>_>::operator[](this,i);
  pstd::span<const_pbrt::Point3<float>_>::operator[](this,3);
  auVar15 = (undefined1  [56])0x0;
  t0_01.y = (float)in_stack_fffffffffffffd3c;
  t0_01.x = in_stack_fffffffffffffd38;
  t0_01.z = in_stack_fffffffffffffd40;
  t1_01.z = in_stack_fffffffffffffd20;
  t1_01.x = (float)(int)in_stack_fffffffffffffd18;
  t1_01.y = (float)(int)((ulong)in_stack_fffffffffffffd18 >> 0x20);
  PVar16 = Lerp<pbrt::Point3,float>(in_stack_fffffffffffffd04,t0_01,t1_01);
  auVar7._0_8_ = PVar16.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar7._8_56_ = auVar15;
  vmovlpd_avx(auVar7._0_16_);
  auVar15 = (undefined1  [56])0x0;
  t0_02.y = (float)in_stack_fffffffffffffd3c;
  t0_02.x = in_stack_fffffffffffffd38;
  t0_02.z = in_stack_fffffffffffffd40;
  t1_02.z = in_stack_fffffffffffffd20;
  t1_02.x = (float)(int)in_stack_fffffffffffffd18;
  t1_02.y = (float)(int)((ulong)in_stack_fffffffffffffd18 >> 0x20);
  PVar16 = Lerp<pbrt::Point3,float>(in_stack_fffffffffffffd04,t0_02,t1_02);
  auVar8._0_8_ = PVar16.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar8._8_56_ = auVar15;
  vmovlpd_avx(auVar8._0_16_);
  auVar15 = (undefined1  [56])0x0;
  t0_03.y = (float)in_stack_fffffffffffffd3c;
  t0_03.x = in_stack_fffffffffffffd38;
  t0_03.z = in_stack_fffffffffffffd40;
  t1_03.z = in_stack_fffffffffffffd20;
  t1_03.x = (float)(int)in_stack_fffffffffffffd18;
  t1_03.y = (float)(int)((ulong)in_stack_fffffffffffffd18 >> 0x20);
  PVar16 = Lerp<pbrt::Point3,float>(in_stack_fffffffffffffd04,t0_03,t1_03);
  auVar9._0_8_ = PVar16.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar9._8_56_ = auVar15;
  vmovlpd_avx(auVar9._0_16_);
  if (in_RDX != (undefined8 *)0x0) {
    auVar15 = ZEXT856(0);
    PVar16.super_Tuple3<pbrt::Point3,_float>.z = SUB84(this,0);
    PVar16.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)i;
    PVar16.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)(i >> 0x20);
    VVar17 = Point3<float>::operator-
                       ((Point3<float> *)CONCAT44(in_XMM0_Da,in_stack_fffffffffffffc68),PVar16);
    auVar10._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar10._8_56_ = auVar15;
    vmovlpd_avx(auVar10._0_16_);
    VVar17.super_Tuple3<pbrt::Vector3,_float>.y = (float)uVar18;
    VVar17.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_XMM0_Da;
    VVar17.super_Tuple3<pbrt::Vector3,_float>.z = s;
    fVar4 = LengthSquared<float>(VVar17);
    if (fVar4 <= 0.0) {
      pstd::span<const_pbrt::Point3<float>_>::operator[](local_20,3);
      pPVar3 = pstd::span<const_pbrt::Point3<float>_>::operator[](local_20,0);
      in_stack_fffffffffffffd20 = (pPVar3->super_Tuple3<pbrt::Point3,_float>).z;
      in_stack_fffffffffffffd18._0_4_ = (pPVar3->super_Tuple3<pbrt::Point3,_float>).x;
      in_stack_fffffffffffffd18._4_4_ = (pPVar3->super_Tuple3<pbrt::Point3,_float>).y;
      auVar15 = ZEXT856(0);
      p_00.super_Tuple3<pbrt::Point3,_float>.z = SUB84(this,0);
      p_00.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)i;
      p_00.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)(i >> 0x20);
      VVar17 = Point3<float>::operator-
                         ((Point3<float> *)CONCAT44(in_XMM0_Da,in_stack_fffffffffffffc68),p_00);
      auVar13._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar13._8_56_ = auVar15;
      uVar1 = vmovlpd_avx(auVar13._0_16_);
      *in_RDX = uVar1;
      *(float *)(in_RDX + 1) = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
    }
    else {
      auVar15 = ZEXT856(0);
      p.super_Tuple3<pbrt::Point3,_float>.z = SUB84(this,0);
      p.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)i;
      p.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)(i >> 0x20);
      VVar17 = Point3<float>::operator-
                         ((Point3<float> *)CONCAT44(in_XMM0_Da,in_stack_fffffffffffffc68),p);
      auVar11._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar11._8_56_ = auVar15;
      uVar1 = vmovlpd_avx(auVar11._0_16_);
      in_stack_fffffffffffffd40 = (float)uVar1;
      auVar15 = ZEXT856(0);
      t.z = in_stack_fffffffffffffc90;
      t._0_8_ = this;
      VVar17 = operator*((int)s,t);
      in_stack_fffffffffffffd38 = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar12._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar12._8_56_ = auVar15;
      uVar1 = vmovlpd_avx(auVar12._0_16_);
      *in_RDX = uVar1;
      *(float *)(in_RDX + 1) = in_stack_fffffffffffffd38;
    }
  }
  auVar15 = (undefined1  [56])0x0;
  t0_04.y = (float)in_stack_fffffffffffffd3c;
  t0_04.x = in_stack_fffffffffffffd38;
  t0_04.z = in_stack_fffffffffffffd40;
  t1_04.z = in_stack_fffffffffffffd20;
  t1_04.x = (float)(int)in_stack_fffffffffffffd18;
  t1_04.y = (float)(int)((ulong)in_stack_fffffffffffffd18 >> 0x20);
  PVar16 = Lerp<pbrt::Point3,float>(in_stack_fffffffffffffd04,t0_04,t1_04);
  auVar14._0_8_ = PVar16.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar14._8_56_ = auVar15;
  uVar1 = vmovlpd_avx(auVar14._0_16_);
  TVar2.z = PVar16.super_Tuple3<pbrt::Point3,_float>.z;
  TVar2.x = (float)(int)uVar1;
  TVar2.y = (float)(int)((ulong)uVar1 >> 0x20);
  return (Point3f)TVar2;
}

Assistant:

PBRT_CPU_GPU inline Point3f EvaluateCubicBezier(pstd::span<const Point3f> cp, Float u,
                                                Vector3f *deriv) {
    Point3f cp1[3] = {Lerp(u, cp[0], cp[1]), Lerp(u, cp[1], cp[2]),
                      Lerp(u, cp[2], cp[3])};
    Point3f cp2[2] = {Lerp(u, cp1[0], cp1[1]), Lerp(u, cp1[1], cp1[2])};
    if (deriv) {
        // Compute B\'ezier curve derivative at $u$
        if (LengthSquared(cp2[1] - cp2[0]) > 0)
            *deriv = 3 * (cp2[1] - cp2[0]);
        else
            *deriv = cp[3] - cp[0];
    }
    return Lerp(u, cp2[0], cp2[1]);
}